

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O0

string * __thiscall
HevcSpsUnit::getDescription_abi_cxx11_(string *__return_storage_ptr__,HevcSpsUnit *this)

{
  bool bVar1;
  allocator<char> local_171;
  string local_170;
  double local_150;
  double fps;
  string local_140 [32];
  string local_120;
  allocator<char> local_f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  allocator<char> local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_19;
  HevcSpsUnit *local_18;
  HevcSpsUnit *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (HevcSpsUnit *)__return_storage_ptr__;
  HevcUnitWithProfile::getProfileString_abi_cxx11_
            (__return_storage_ptr__,&this->super_HevcUnitWithProfile);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0," Resolution: ",&local_a1);
  int32uToStr_abi_cxx11_(&local_d8,&this->pic_width_in_luma_samples);
  std::operator+(&local_80,&local_a0,&local_d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,":",&local_f9);
  std::operator+(&local_60,&local_80,&local_f8);
  int32uToStr_abi_cxx11_(&local_120,&this->pic_height_in_luma_samples);
  std::operator+(&local_40,&local_60,&local_120);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  fps._6_1_ = 0;
  fps._4_1_ = 0;
  if (((this->super_HevcUnitWithProfile).interlaced_source_flag & 1U) == 0) {
    std::allocator<char>::allocator();
    fps._4_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (local_140,"p",(allocator<char> *)((long)&fps + 5));
  }
  else {
    std::allocator<char>::allocator();
    fps._6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (local_140,"i",(allocator<char> *)((long)&fps + 7));
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_140);
  std::__cxx11::string::~string(local_140);
  if ((fps._4_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&fps + 5));
  }
  if ((fps._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&fps + 7));
  }
  local_150 = getFPS(this);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"  Frame rate: ");
  bVar1 = false;
  if ((local_150 != 0.0) || (NAN(local_150))) {
    doubleToStr_abi_cxx11_(&local_170,&local_150,-1);
  }
  else {
    std::allocator<char>::allocator();
    bVar1 = true;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"not found",&local_171);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  if (bVar1) {
    std::allocator<char>::~allocator(&local_171);
  }
  return __return_storage_ptr__;
}

Assistant:

string HevcSpsUnit::getDescription() const
{
    string result = getProfileString();
    result += string(" Resolution: ") + int32uToStr(pic_width_in_luma_samples) + string(":") +
              int32uToStr(pic_height_in_luma_samples);
    result += interlaced_source_flag ? string("i") : string("p");

    const double fps = getFPS();
    result += "  Frame rate: ";
    result += fps != 0.0 ? doubleToStr(fps) : string("not found");
    return result;
}